

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void usageMessage(ostream *stream,char *program_name,bool verbose)

{
  ostream *poVar1;
  undefined3 in_register_00000011;
  
  poVar1 = std::operator<<(stream,"Usage: ");
  poVar1 = std::operator<<(poVar1,program_name);
  poVar1 = std::operator<<(poVar1," [options] infile outfile");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (CONCAT31(in_register_00000011,verbose) != 0) {
    std::operator<<(stream,
                    "\nRead an OpenEXR image from infile, generate a preview\nimage, add it to the image\'s header, and save the result\nin outfile.  Infile and outfile must not refer to the same\nfile (the program cannot edit an image file \"in place\").\n\nOptions:\n\n  -w x          sets the width of the preview image to x pixels\n                (default is 100)\n\n  -e s          adjusts the preview image\'s exposure by s f-stops\n                (default is 0).  Positive values make the image\n                brighter, negative values make it darker.\n\n  -v            verbose mode\n\n  -h, --help    print this message\n\n      --version print version information\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
                   );
    return;
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " [options] infile outfile" << endl;

    if (verbose)
        stream
            << "\n"
               "Read an OpenEXR image from infile, generate a preview\n"
               "image, add it to the image's header, and save the result\n"
               "in outfile.  Infile and outfile must not refer to the same\n"
               "file (the program cannot edit an image file \"in place\").\n"
               "\n"
               "Options:\n"
               "\n"
               "  -w x          sets the width of the preview image to x pixels\n"
               "                (default is 100)\n"
               "\n"
               "  -e s          adjusts the preview image's exposure by s f-stops\n"
               "                (default is 0).  Positive values make the image\n"
               "                brighter, negative values make it darker.\n"
               "\n"
               "  -v            verbose mode\n"
               "\n"
               "  -h, --help    print this message\n"
               "\n"
               "      --version print version information\n"
               "\n"
               "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
               "";
}